

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

bool amrex::AmrLevel::isStateVariable(string *name,int *typ,int *n)

{
  size_t __n;
  int iVar1;
  int iVar2;
  StateDescriptor *this;
  string *psVar3;
  
  *typ = 0;
  iVar1 = DescriptorList::size((DescriptorList *)desc_lst);
  if (0 < iVar1) {
    do {
      this = DescriptorList::operator[]((DescriptorList *)desc_lst,*typ);
      *n = 0;
      iVar1 = StateDescriptor::nComp(this);
      if (0 < iVar1) {
        do {
          psVar3 = StateDescriptor::name_abi_cxx11_(this,*n);
          __n = psVar3->_M_string_length;
          if (__n == name->_M_string_length) {
            if (__n == 0) {
              return true;
            }
            iVar1 = bcmp((psVar3->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n);
            if (iVar1 == 0) {
              return true;
            }
          }
          iVar1 = *n;
          *n = iVar1 + 1;
          iVar2 = StateDescriptor::nComp(this);
        } while (iVar1 + 1 < iVar2);
      }
      iVar1 = *typ;
      *typ = iVar1 + 1;
      iVar2 = DescriptorList::size((DescriptorList *)desc_lst);
    } while (iVar1 + 1 < iVar2);
  }
  return false;
}

Assistant:

bool
AmrLevel::isStateVariable (const std::string& name, int& typ, int& n)
{
    for (typ = 0; typ < desc_lst.size(); typ++)
    {
        const StateDescriptor& desc = desc_lst[typ];

        for (n = 0; n < desc.nComp(); n++)
        {
            if (desc.name(n) == name)
                return true;
        }
    }
    return false;
}